

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

int ddLeavesInt(DdNode *n)

{
  int iVar1;
  int iVar2;
  int eval;
  int tval;
  DdNode *n_local;
  
  if (((ulong)n->next & 1) == 0) {
    n->next = (DdNode *)((ulong)n->next ^ 1);
    if (n->index == 0x7fffffff) {
      n_local._4_4_ = 1;
    }
    else {
      iVar1 = ddLeavesInt((n->type).kids.T);
      iVar2 = ddLeavesInt((DdNode *)((ulong)(n->type).kids.E & 0xfffffffffffffffe));
      n_local._4_4_ = iVar1 + iVar2;
    }
  }
  else {
    n_local._4_4_ = 0;
  }
  return n_local._4_4_;
}

Assistant:

static int
ddLeavesInt(
  DdNode * n)
{
    int tval, eval;

    if (Cudd_IsComplement(n->next)) {
        return(0);
    }
    n->next = Cudd_Not(n->next);
    if (cuddIsConstant(n)) {
        return(1);
    }
    tval = ddLeavesInt(cuddT(n));
    eval = ddLeavesInt(Cudd_Regular(cuddE(n)));
    return(tval + eval);

}